

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

void arena_unbind(tsd_t *tsd,uint ind,_Bool internal)

{
  uint8_t *puVar1;
  arena_t *arena;
  
  arena = (arena_t *)duckdb_je_arenas[ind].repr;
  if (arena == (arena_t *)0x0) {
    arena = (arena_t *)0x0;
  }
  duckdb_je_arena_nthreads_dec(arena,internal);
  puVar1 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard +
           (ulong)!internal * 8 + -0x19;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  return;
}

Assistant:

static void
arena_unbind(tsd_t *tsd, unsigned ind, bool internal) {
	arena_t *arena;

	arena = arena_get(tsd_tsdn(tsd), ind, false);
	arena_nthreads_dec(arena, internal);

	if (internal) {
		tsd_iarena_set(tsd, NULL);
	} else {
		tsd_arena_set(tsd, NULL);
	}
}